

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::implicitNamedPort<slang::ast::PortSymbol>
          (PortConnectionBuilder *this,PortSymbol *port,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes,
          SourceRange range,bool isWildcard)

{
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_01;
  string_view arg;
  string_view arg_00;
  LookupLocation target;
  bool bVar1;
  PortConnectionBuilder *this_00;
  Symbol *pSVar2;
  Compilation *this_01;
  PortConnection *in_RCX;
  PortSymbol *in_RSI;
  SourceLocation in_RDI;
  size_t in_R8;
  char *in_R9;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  undefined1 in_stack_00000010 [16];
  DiagCode in_stack_00000024;
  PortConnection *conn;
  Diagnostic *diag;
  Symbol *symbol;
  bitmask<slang::ast::LookupFlags> flags;
  Scope *in_stack_000001c8;
  bitmask<slang::ast::LookupFlags> in_stack_000001d4;
  undefined1 in_stack_000001d8 [16];
  undefined4 in_stack_fffffffffffffec8;
  LookupFlags in_stack_fffffffffffffecc;
  Symbol **in_stack_fffffffffffffee0;
  PortSymbol *in_stack_fffffffffffffee8;
  PortConnectionBuilder *in_stack_fffffffffffffef0;
  SourceLocation in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Diagnostic *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  bitmask<slang::ast::LookupFlags> local_4c;
  bitmask<slang::ast::InstanceFlags> local_45;
  bitmask<slang::ast::LookupFlags> local_44;
  bitmask<slang::ast::LookupFlags> local_40;
  byte local_39;
  PortSymbol *local_38;
  size_t local_28;
  char *local_20;
  PortConnection *local_10;
  Compilation *local_8;
  
  local_39 = in_stack_00000008 & 1;
  local_38 = in_RSI;
  local_28 = in_R8;
  local_20 = in_R9;
  local_10 = in_RCX;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_40);
  if ((local_39 & 1) != 0) {
    bitmask<slang::ast::LookupFlags>::bitmask(&local_44,DisallowWildcardImport);
    bitmask<slang::ast::LookupFlags>::operator|=(&local_40,&local_44);
  }
  this_00 = (PortConnectionBuilder *)(*(long *)(*(long *)((long)in_RDI + 8) + 0x50) + 0x88);
  bitmask<slang::ast::InstanceFlags>::bitmask(&local_45,FromBind);
  bVar1 = bitmask<slang::ast::InstanceFlags>::has
                    ((bitmask<slang::ast::InstanceFlags> *)this_00,
                     (bitmask<slang::ast::InstanceFlags> *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (bVar1) {
    local_4c = ast::operator|((LookupFlags)this_00,in_stack_fffffffffffffecc);
    bitmask<slang::ast::LookupFlags>::operator|=(&local_40,&local_4c);
  }
  pSVar2 = Lookup::unqualified(in_stack_000001c8,(string_view)in_stack_000001d8,in_stack_000001d4);
  if (pSVar2 == (Symbol *)0x0) {
    if ((((local_39 & 1) == 0) || (bVar1 = PortSymbol::hasInitializer(local_38), !bVar1)) ||
       (local_38->direction != In)) {
      Scope::addDiag((Scope *)CONCAT71(in_stack_00000009,in_stack_00000008),in_stack_00000024,
                     (SourceRange)in_stack_00000010);
      arg._M_str = in_stack_ffffffffffffff20;
      arg._M_len = in_stack_ffffffffffffff18;
      Diagnostic::operator<<(in_stack_ffffffffffffff10,arg);
      local_8 = (Compilation *)
                emptyConnection(this_00,(PortSymbol *)
                                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ));
    }
    else {
      attributes_00._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffff00;
      attributes_00._M_ptr = (pointer)in_stack_fffffffffffffef8;
      attributes_00._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffff04;
      local_8 = (Compilation *)
                defaultConnection(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,attributes_00)
      ;
    }
  }
  else {
    target._8_7_ = in_stack_ffffffffffffff38;
    target.scope = (Scope *)in_stack_ffffffffffffff30;
    target._15_1_ = in_stack_ffffffffffffff3f;
    Symbol::isDeclaredBefore
              ((Symbol *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),target);
    bVar1 = std::optional<bool>::value_or<bool>((optional<bool> *)in_RDI,(bool *)this_00);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      Scope::addDiag((Scope *)CONCAT71(in_stack_00000009,in_stack_00000008),in_stack_00000024,
                     (SourceRange)in_stack_00000010);
      arg_00._M_str = local_20;
      arg_00._M_len = local_28;
      Diagnostic::operator<<((Diagnostic *)(local_38->super_Symbol).name._M_str,arg_00);
      in_stack_ffffffffffffff04 = 0x50001;
      in_stack_fffffffffffffef8 = pSVar2->location;
      Diagnostic::addNote((Diagnostic *)this_00,SUB84((ulong)in_stack_fffffffffffffee0 >> 0x20,0),
                          in_RDI);
    }
    this_01 = (Compilation *)
              BumpAllocator::
              emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,slang::ast::Symbol_const*&,slang::SourceRange&>
                        ((BumpAllocator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         in_stack_fffffffffffffee0,(SourceRange *)in_RDI);
    bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                      ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                       0x47849f);
    local_8 = this_01;
    if (!bVar1) {
      attributes_01._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffff00;
      attributes_01._M_ptr = (pointer)in_stack_fffffffffffffef8;
      attributes_01._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffff04;
      Compilation::setAttributes(this_01,local_10,attributes_01);
      local_8 = this_01;
    }
  }
  return (PortConnection *)local_8;
}

Assistant:

PortConnection* implicitNamedPort(const TPort& port,
                                      std::span<const AttributeSymbol* const> attributes,
                                      SourceRange range, bool isWildcard) {
        // An implicit named port connection is semantically equivalent to `.port(port)` except:
        // - Can't create implicit net declarations this way
        // - Port types need to be equivalent, not just assignment compatible
        // - An implicit connection between nets of two dissimilar net types shall issue an
        //   error when it is a warning in an explicit named port connection

        bitmask<LookupFlags> flags;
        if (isWildcard)
            flags |= LookupFlags::DisallowWildcardImport;

        if (instance.body.flags.has(InstanceFlags::FromBind))
            flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

        auto symbol = Lookup::unqualified(scope, port.name, flags);
        if (!symbol) {
            // If this is a wildcard connection, we're allowed to use the port's default value,
            // if it has one.
            if (isWildcard && port.hasInitializer() && port.direction == ArgumentDirection::In)
                return defaultConnection(port, attributes);

            scope.addDiag(diag::ImplicitNamedPortNotFound, range) << port.name;
            return emptyConnection(port);
        }

        if (!symbol->isDeclaredBefore(lookupLocation).value_or(true)) {
            auto& diag = scope.addDiag(diag::UsedBeforeDeclared, range);
            diag << port.name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
        }

        auto conn = comp.emplace<PortConnection>(port, symbol, range);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }